

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::DefaultsTest::prepare(DefaultsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 *puVar4;
  MessageBuilder local_198;
  long local_18;
  Functions *gl;
  DefaultsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  this->m_gl_getTransformFeedbackiv = *(GetTransformFeedbackiv_ProcAddress *)(local_18 + 0xb30);
  this->m_gl_getTransformFeedbacki_v = *(GetTransformFeedbacki_v_ProcAddress *)(local_18 + 0xb28);
  this->m_gl_getTransformFeedbacki64_v =
       *(GetTransformFeedbacki64_v_ProcAddress *)(local_18 + 0xb20);
  if (((this->m_gl_getTransformFeedbackiv != (GetTransformFeedbackiv_ProcAddress)0x0) &&
      (this->m_gl_getTransformFeedbacki_v != (GetTransformFeedbacki_v_ProcAddress)0x0)) &&
     (this->m_gl_getTransformFeedbacki64_v != (GetTransformFeedbacki64_v_ProcAddress)0x0)) {
    (**(code **)(local_18 + 0x408))(1,&this->m_xfb_dsa);
    dVar2 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar2,"glCreateTransformFeedbacks have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x139);
    (**(code **)(local_18 + 0x868))(0x8c8b,&this->m_xfb_indexed_binding_points_count);
    dVar2 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar2,"glIntegerv have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x13d);
    return;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_198,(char (*) [42])"Function pointers are set to NULL values.");
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void DefaultsTest::prepare()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching function pointers. */
	m_gl_getTransformFeedbackiv	= (GetTransformFeedbackiv_ProcAddress)gl.getTransformFeedbackiv;
	m_gl_getTransformFeedbacki_v   = (GetTransformFeedbacki_v_ProcAddress)gl.getTransformFeedbacki_v;
	m_gl_getTransformFeedbacki64_v = (GetTransformFeedbacki64_v_ProcAddress)gl.getTransformFeedbacki64_v;

	if ((DE_NULL == m_gl_getTransformFeedbackiv) || (DE_NULL == m_gl_getTransformFeedbacki_v) ||
		(DE_NULL == m_gl_getTransformFeedbacki64_v))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function pointers are set to NULL values."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}

	/* XFB object creation */
	gl.createTransformFeedbacks(1, &m_xfb_dsa);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	/* Query limits. */
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &m_xfb_indexed_binding_points_count);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIntegerv have failed");
}